

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_exporttype_t * wasm_exporttype_new(wasm_name_t *name,wasm_externtype_t *type)

{
  wasm_exporttype_t *this;
  pointer pEVar1;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_68;
  string local_60;
  ExportType local_40;
  wasm_externtype_t *local_18;
  wasm_externtype_t *type_local;
  wasm_name_t *name_local;
  
  local_18 = type;
  type_local = (wasm_externtype_t *)name;
  this = (wasm_exporttype_t *)operator_new(0x40);
  ToString_abi_cxx11_(&local_60,(wasm_message_t *)type_local);
  pEVar1 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::operator->(&local_18->I);
  (*pEVar1->_vptr_ExternType[2])(&local_68);
  wabt::interp::ExportType::ExportType(&local_40,&local_60,&local_68);
  wasm_exporttype_t::wasm_exporttype_t(this,&local_40);
  wabt::interp::ExportType::~ExportType(&local_40);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_68);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

own wasm_exporttype_t* wasm_exporttype_new(own wasm_name_t* name,
                                           wasm_externtype_t* type) {
  return new wasm_exporttype_t{ExportType{ToString(name), type->I->Clone()}};
}